

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void celero::executor::RunAllExperiments(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  TestVector *pTVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  shared_ptr<celero::Benchmark> local_30;
  undefined1 local_20 [8];
  shared_ptr<celero::Benchmark> bmark;
  size_t i;
  
  bmark.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = bmark.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    pTVar3 = TestVector::Instance();
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)TestVector::size(pTVar3);
    if (p_Var4 <= _Var1._M_pi) break;
    pTVar3 = TestVector::Instance();
    TestVector::operator[]((TestVector *)local_20,(size_t)pTVar3);
    bVar2 = std::operator!=((shared_ptr<celero::Benchmark> *)local_20,(nullptr_t)0x0);
    if (bVar2) {
      std::shared_ptr<celero::Benchmark>::shared_ptr
                (&local_30,(shared_ptr<celero::Benchmark> *)local_20);
      RunExperiments(&local_30);
      std::shared_ptr<celero::Benchmark>::~shared_ptr(&local_30);
    }
    std::shared_ptr<celero::Benchmark>::~shared_ptr((shared_ptr<celero::Benchmark> *)local_20);
    bmark.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(bmark.super___shared_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
  }
  return;
}

Assistant:

void executor::RunAllExperiments()
{
	// Run through all the tests in ascending order.
	for(size_t i = 0; i < celero::TestVector::Instance().size(); i++)
	{
		auto bmark = celero::TestVector::Instance()[i];
		if(bmark != nullptr)
		{
			executor::RunExperiments(bmark);
		}
	}
}